

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

date_t __thiscall
duckdb::DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
          (DateTruncBinaryOperator *this,string_t specifier,date_t date)

{
  DatePartSpecifier DVar1;
  bool bVar2;
  date_t dVar3;
  date_t dVar4;
  int32_t iVar5;
  NotImplementedException *this_00;
  undefined4 in_register_0000000c;
  int year;
  long lVar6;
  undefined1 auVar7 [12];
  date_t result;
  int32_t yyyy;
  int32_t dd;
  date_t in_stack_ffffffffffffff7c;
  string local_80;
  int32_t local_5c;
  string local_58;
  undefined8 local_38;
  long local_30;
  
  local_30 = specifier.value._0_8_;
  dVar4.days = specifier.value._8_4_;
  lVar6 = local_30;
  if ((uint)this < 0xd) {
    lVar6 = (long)&local_38 + 4;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38 = this;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,lVar6,((ulong)this & 0xffffffff) + lVar6,
             CONCAT44(in_register_0000000c,date.days));
  DVar1 = GetDatePartSpecifier(&local_58);
  bVar2 = Value::IsFinite<duckdb::date_t>(dVar4);
  if (!bVar2) {
    dVar3.days = in_stack_ffffffffffffff7c.days;
    bVar2 = TryCast::Operation<duckdb::date_t,duckdb::date_t>
                      (dVar4,(date_t *)&stack0xffffffffffffff7c,false);
    if (!bVar2) {
      auVar7 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::date_t>
                (&local_80,(duckdb *)(ulong)(uint)dVar4.days,(date_t)auVar7._8_4_);
      InvalidInputException::InvalidInputException(auVar7._0_8_,&local_80);
      __cxa_throw(auVar7._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    goto switchD_00eebece_caseD_2;
  }
  dVar3.days = dVar4.days;
  switch(DVar1) {
  case BEGIN_BIGINT:
    year = Date::ExtractYear(in_stack_ffffffffffffff7c);
    break;
  case MONTH:
    year = Date::ExtractYear(in_stack_ffffffffffffff7c);
    iVar5 = Date::ExtractMonth(dVar4);
    goto LAB_00eebfd9;
  case DAY:
  case MICROSECONDS:
  case MILLISECONDS:
  case SECOND:
  case MINUTE:
  case HOUR:
  case DOW:
  case ISODOW:
  case DOY:
  case BEGIN_DOUBLE:
  case JULIAN_DAY:
    goto switchD_00eebece_caseD_2;
  case DECADE:
    iVar5 = Date::ExtractYear(in_stack_ffffffffffffff7c);
    year = (iVar5 / 10) * 10;
    break;
  case CENTURY:
    iVar5 = Date::ExtractYear(in_stack_ffffffffffffff7c);
    year = (iVar5 / 100) * 100;
    break;
  case MILLENNIUM:
    iVar5 = Date::ExtractYear(in_stack_ffffffffffffff7c);
    year = (iVar5 / 1000) * 1000;
    break;
  case WEEK:
  case YEARWEEK:
    dVar3 = Date::GetMondayOfCurrentWeek(dVar4);
    goto switchD_00eebece_caseD_2;
  case ISOYEAR:
    dVar4 = Date::GetMondayOfCurrentWeek(dVar4);
    iVar5 = Date::ExtractISOWeekNumber(dVar4);
    dVar3.days = dVar4.days + iVar5 * -7 + 7;
    goto switchD_00eebece_caseD_2;
  case QUARTER:
    Date::Convert(dVar4,(int32_t *)&local_80,(int32_t *)&stack0xffffffffffffff7c,&local_5c);
    dVar3 = Date::FromDate((int32_t)local_80._M_dataplus._M_p,
                           ((in_stack_ffffffffffffff7c.days + -1) / 3) * 3 + 1,1);
    goto switchD_00eebece_caseD_2;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Specifier type not implemented for DATETRUNC","");
    NotImplementedException::NotImplementedException(this_00,&local_80);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar5 = 1;
LAB_00eebfd9:
  dVar3 = Date::FromDate(year,iVar5,1);
switchD_00eebece_caseD_2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return (date_t)dVar3.days;
}

Assistant:

static inline TR Operation(TA specifier, TB date) {
		return TruncateElement<TB, TR>(GetDatePartSpecifier(specifier.GetString()), date);
	}